

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O0

BBox * __thiscall CMU462::StaticScene::Sphere::get_bbox(BBox *__return_storage_ptr__,Sphere *this)

{
  Vector3D local_78;
  Vector3D local_60;
  Vector3D local_48;
  Vector3D local_30;
  Sphere *local_18;
  Sphere *this_local;
  
  local_18 = this;
  this_local = (Sphere *)__return_storage_ptr__;
  Vector3D::Vector3D(&local_48,this->r,this->r,this->r);
  Vector3D::operator-(&local_30,&this->o,&local_48);
  Vector3D::Vector3D(&local_78,this->r,this->r,this->r);
  Vector3D::operator+(&local_60,&this->o,&local_78);
  BBox::BBox(__return_storage_ptr__,&local_30,&local_60);
  return __return_storage_ptr__;
}

Assistant:

BBox get_bbox() const {
    return BBox(o - Vector3D(r,r,r), o + Vector3D(r,r,r));
  }